

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

int __thiscall
kj::ArrayBuilder<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>::truncate
          (ArrayBuilder<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_> *this,
          char *__file,__off_t __length)

{
  Orphan<capnp::compiler::Declaration::AnnotationApplication> *pOVar1;
  int in_EAX;
  int extraout_EAX;
  OrphanBuilder *this_00;
  
  pOVar1 = this->ptr;
  while (pOVar1 + (long)__file < this->pos) {
    this_00 = &this->pos[-1].builder;
    this->pos = (RemoveConst<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_> *)
                this_00;
    capnp::_::OrphanBuilder::~OrphanBuilder(this_00);
    in_EAX = extraout_EAX;
  }
  return in_EAX;
}

Assistant:

void truncate(size_t size) {
    KJ_IREQUIRE(size <= this->size(), "can't use truncate() to expand");

    T* target = ptr + size;
    if (__has_trivial_destructor(T)) {
      pos = target;
    } else {
      while (pos > target) {
        kj::dtor(*--pos);
      }
    }
  }